

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif.cpp
# Opt level: O1

void __thiscall
Potassco::AspifOutput::theoryAtom(AspifOutput *this,Id_t atomOrZero,Id_t termId,IdSpan *elements)

{
  ostream *poVar1;
  
  std::ostream::_M_insert<unsigned_long>((ulong)this->os_);
  poVar1 = this->os_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::ostream::operator<<((ostream *)poVar1,5);
  poVar1 = this->os_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::ostream::operator<<((ostream *)poVar1,atomOrZero);
  poVar1 = this->os_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::ostream::operator<<((ostream *)poVar1,termId);
  add(this,elements);
  std::__ostream_insert<char,std::char_traits<char>>(this->os_,"\n",1);
  return;
}

Assistant:

void AspifOutput::theoryAtom(Id_t atomOrZero, Id_t termId, const IdSpan& elements) {
	startDir(Directive_t::Theory).add(Theory_t::Atom).add(atomOrZero).add(termId).add(elements).endDir();
}